

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O3

bool __thiscall cmParseCacheCoverage::LoadCoverageData(cmParseCacheCoverage *this,string *d)

{
  bool bVar1;
  int iVar2;
  Status SVar3;
  unsigned_long uVar4;
  char *__s;
  uint uVar5;
  unsigned_long dindex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  Directory dir;
  string path;
  string file;
  Directory local_f0;
  string local_e8;
  string local_c8;
  cmParseCacheCoverage *local_a8;
  string *local_a0;
  unsigned_long local_98;
  string local_90;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  cmsys::Directory::Directory(&local_f0);
  local_a0 = d;
  SVar3 = cmsys::Directory::Load(&local_f0,d,(string *)0x0);
  if (SVar3.Kind_ == Success) {
    uVar4 = cmsys::Directory::GetNumberOfFiles(&local_f0);
    bVar1 = true;
    if (uVar4 != 0) {
      uVar5 = 1;
      dindex = 0;
      local_a8 = this;
      local_98 = uVar4;
      do {
        __s = cmsys::Directory::GetFile(&local_f0,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,__s,(allocator<char> *)&local_90);
        iVar2 = std::__cxx11::string::compare((char *)&local_c8);
        if (((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)&local_c8), iVar2 != 0))
           && (bVar1 = cmsys::SystemTools::FileIsDirectory(&local_c8), !bVar1)) {
          local_90._M_string_length = (size_type)(local_a0->_M_dataplus)._M_p;
          local_90._M_dataplus._M_p = (pointer)local_a0->_M_string_length;
          local_60 = 1;
          local_90.field_2._8_8_ = local_50;
          local_50[0] = 0x2f;
          local_90.field_2._M_allocated_capacity = 1;
          local_70 = local_c8._M_string_length;
          local_68 = local_c8._M_dataplus._M_p;
          views._M_len = 3;
          views._M_array = (iterator)&local_90;
          local_58 = (undefined1 *)local_90.field_2._8_8_;
          cmCatViews_abi_cxx11_(&local_e8,views);
          cmsys::SystemTools::GetFilenameLastExtension(&local_90,&local_e8);
          iVar2 = std::__cxx11::string::compare((char *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((iVar2 == 0) && (bVar1 = ReadCMCovFile(local_a8,local_e8._M_dataplus._M_p), !bVar1)) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0019ecac;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        dindex = (unsigned_long)uVar5;
        uVar5 = uVar5 + 1;
      } while (dindex < local_98);
      bVar1 = true;
    }
  }
  else {
LAB_0019ecac:
    bVar1 = false;
  }
  cmsys::Directory::~Directory(&local_f0);
  return bVar1;
}

Assistant:

bool cmParseCacheCoverage::LoadCoverageData(std::string const& d)
{
  // load all the .mcov files in the specified directory
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = cmStrCat(d, '/', file);
      if (cmSystemTools::GetFilenameLastExtension(path) == ".cmcov") {
        if (!this->ReadCMCovFile(path.c_str())) {
          return false;
        }
      }
    }
  }
  return true;
}